

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

void adt_list_insert_after(adt_list_t *self,adt_list_elem_t *pIter,void *pItem)

{
  adt_list_elem_t *paVar1;
  
  if ((pItem != (void *)0x0 && (pIter != (adt_list_elem_t *)0x0 && self != (adt_list_t *)0x0)) &&
     (paVar1 = adt_list_elem_new(pItem,pIter->pNext,pIter), paVar1 != (adt_list_elem_t *)0x0)) {
    if (pIter->pNext != (adt_list_elem_tag *)0x0) {
      pIter->pNext->pPrev = paVar1;
    }
    pIter->pNext = paVar1;
    if (self->pLast == pIter) {
      self->pLast = paVar1;
    }
  }
  return;
}

Assistant:

void adt_list_insert_after(adt_list_t *self, adt_list_elem_t *pIter, void *pItem)
{
   if( (self != 0) && (pIter != 0) && (pItem != 0) )
   {
      adt_list_elem_t *pElem = adt_list_elem_new(pItem,pIter->pNext, pIter);
      if (pElem != 0)
      {
         if (pIter->pNext != 0)
         {
            pIter->pNext->pPrev = pElem;
         }
         pIter->pNext = pElem;
         //adjust pLast in case we are inserting at end of list
         if (pIter == self->pLast)
         {
            self->pLast = pElem;
         }
      }
   }
}